

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPDepobjUpdateClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPDepobjUpdateClause *this)

{
  OpenMPDepobjUpdateClauseDependeceType OVar1;
  ulong uVar2;
  allocator<char> local_51;
  OpenMPDepobjUpdateClauseDependeceType type;
  string clause_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPDepobjUpdateClause *local_18;
  OpenMPDepobjUpdateClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPDepobjUpdateClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"update ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&type,"(",&local_51);
  std::allocator<char>::~allocator(&local_51);
  OVar1 = getType(this);
  switch(OVar1) {
  case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_in:
    std::__cxx11::string::operator+=((string *)&type,"in");
    break;
  case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_out:
    std::__cxx11::string::operator+=((string *)&type,"out");
    break;
  case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_inout:
    std::__cxx11::string::operator+=((string *)&type,"inout");
    break;
  case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_mutexinoutset:
    std::__cxx11::string::operator+=((string *)&type,"mutexinoutset");
    break;
  case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_depobj:
    std::__cxx11::string::operator+=((string *)&type,"depobj");
    break;
  case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_sink:
    std::__cxx11::string::operator+=((string *)&type,"sink");
    break;
  case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_source:
    std::__cxx11::string::operator+=((string *)&type,"source");
  }
  std::__cxx11::string::operator+=((string *)&type,") ");
  uVar2 = std::__cxx11::string::size();
  if (3 < uVar2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&type);
  }
  local_19 = 1;
  std::__cxx11::string::~string((string *)&type);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPDepobjUpdateClause::toString() {

    std::string result = "update ";
    std::string clause_string = "(";
    OpenMPDepobjUpdateClauseDependeceType type = this->getType();
    switch (type) {
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_source:
            clause_string += "source";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_in:
            clause_string += "in";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_out:
            clause_string += "out";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_inout:
            clause_string += "inout";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_mutexinoutset:
            clause_string += "mutexinoutset";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_depobj:
            clause_string += "depobj";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_sink:
            clause_string += "sink";
            break;
        default:
            ;
    }
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}